

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotation,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcProduct *this;
  
  this = (IfcProduct *)operator_new(0x128);
  *(undefined ***)&this->field_0x110 = &PTR__Object_007e6a70;
  *(undefined8 *)&this[1].super_IfcObject = 0;
  *(char **)&this[1].super_IfcObject.field_0x8 = "IfcAnnotation";
  Assimp::IFC::Schema_2x3::IfcProduct::IfcProduct(this,&PTR_construction_vtable_24__00853350);
  *(undefined ***)&this->super_IfcObject = &PTR__IfcAnnotation_00853270;
  *(undefined ***)&this->field_0x110 = &PTR__IfcAnnotation_00853338;
  *(undefined ***)&(this->super_IfcObject).field_0x88 = &PTR__IfcAnnotation_00853298;
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcAnnotation_008532c0;
  *(undefined ***)&(this->super_IfcObject).field_0xd0 = &PTR__IfcAnnotation_008532e8;
  *(undefined ***)&this->field_0x100 = &PTR__IfcAnnotation_00853310;
  GenericFill<Assimp::IFC::Schema_2x3::IfcAnnotation>(db,params,(IfcAnnotation *)this);
  return (Object *)
         (&(this->super_IfcObject).field_0x0 + *(long *)(*(long *)&this->super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }